

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

string * __thiscall
phosg::preadx_abi_cxx11_(string *__return_storage_ptr__,phosg *this,int fd,size_t size,off_t offset)

{
  undefined4 in_register_00000014;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,CONCAT44(in_register_00000014,fd),'\0');
  preadx((int)this,(__return_storage_ptr__->_M_dataplus)._M_p,CONCAT44(in_register_00000014,fd),size
        );
  return __return_storage_ptr__;
}

Assistant:

string preadx(int fd, size_t size, off_t offset) {
  string ret(size, 0);
  preadx(fd, ret.data(), size, offset);
  return ret;
}